

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_putstatic(ExecutionEngine *this)

{
  byte bVar1;
  u2 index;
  cp_info *pcVar2;
  bool bVar3;
  Frame *pFVar4;
  cp_info **ppcVar5;
  u1 *puVar6;
  char *pcVar7;
  MethodArea *this_00;
  ClassRuntime *this_01;
  ClassFile *pCVar8;
  ulong uVar9;
  ulong uVar10;
  Value VVar11;
  string fieldName;
  string superClassName;
  string fieldDescriptor;
  string className;
  allocator local_101;
  Frame *local_100;
  VMStack *local_f8;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0;
  string local_90;
  byte *local_70 [2];
  byte local_60 [16];
  string local_50;
  
  local_f8 = VMStack::getInstance();
  pFVar4 = VMStack::getTopFrame(local_f8);
  ppcVar5 = Frame::getConstantPool(pFVar4);
  pcVar2 = *ppcVar5;
  local_100 = pFVar4;
  puVar6 = Frame::getCode(pFVar4,pFVar4->pc);
  uVar10 = (ulong)(ushort)(*(ushort *)(puVar6 + 1) << 8 | *(ushort *)(puVar6 + 1) >> 8);
  if (pcVar2[uVar10 - 1].tag != '\t') {
    __assert_fail("fieldCP.tag == CONSTANT_Fieldref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xe25,"void ExecutionEngine::i_putstatic()");
  }
  uVar9 = (ulong)pcVar2[uVar10 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant(pcVar2,pcVar2[uVar10 - 1].info.fieldref_info.class_index);
  std::__cxx11::string::string((string *)&local_50,pcVar7,(allocator *)&local_f0);
  if (pcVar2[uVar9 - 1].tag != '\f') {
    __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xe2c,"void ExecutionEngine::i_putstatic()");
  }
  index = pcVar2[uVar9 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant(pcVar2,pcVar2[uVar9 - 1].info.fieldref_info.class_index);
  std::__cxx11::string::string((string *)&local_f0,pcVar7,(allocator *)local_70);
  pcVar7 = getFormattedConstant(pcVar2,index);
  std::__cxx11::string::string((string *)local_70,pcVar7,(allocator *)&local_d0);
  this_00 = MethodArea::getInstance();
  this_01 = MethodArea::loadClassNamed(this_00,&local_50);
  if (this_01 != (ClassRuntime *)0x0) {
    do {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_f0,local_f0 + local_e8);
      bVar3 = ClassRuntime::fieldExists(this_01,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (bVar3) {
        pFVar4 = VMStack::getTopFrame(local_f8);
        if (pFVar4 == local_100) {
          VVar11 = Frame::popTopOfOperandStack(local_100);
          uVar10 = VVar11._0_8_;
          if (VVar11.type >> 1 == 3) {
            Frame::popTopOfOperandStack(local_100);
          }
          else {
            bVar1 = *local_70[0];
            if (bVar1 < 0x53) {
              if (bVar1 == 0x42) {
                uVar10 = 0x100000001;
              }
              else if (bVar1 == 0x43) {
                uVar10 = uVar10 & 0xffffffff | 0x200000000;
              }
            }
            else if (bVar1 == 0x53) {
              uVar10 = uVar10 & 0xffffffff | 0x300000000;
            }
            else if (bVar1 == 0x5a) {
              uVar10 = uVar10 & 0xffffffff;
            }
          }
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_f0,local_f0 + local_e8);
          VVar11.printType = (int)uVar10;
          VVar11.type = (int)(uVar10 >> 0x20);
          ClassRuntime::putValueIntoField(this_01,VVar11,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          local_100->pc = local_100->pc + 3;
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        if (local_f0 != local_e0) {
          operator_delete(local_f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        return;
      }
      pCVar8 = ClassRuntime::getClassFile(this_01);
      if (pCVar8->super_class == 0) break;
      pCVar8 = ClassRuntime::getClassFile(this_01);
      pcVar2 = pCVar8->constant_pool;
      pCVar8 = ClassRuntime::getClassFile(this_01);
      pcVar7 = getFormattedConstant(pcVar2,pCVar8->super_class);
      std::__cxx11::string::string((string *)&local_d0,pcVar7,&local_101);
      this_01 = MethodArea::loadClassNamed(this_00,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    } while (this_01 != (ClassRuntime *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"NoSuchFieldError",0x10);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(1);
}

Assistant:

void ExecutionEngine::i_putstatic() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t fieldIndex = (byte1 << 8) | byte2;
    cp_info fieldCP = constantPool[fieldIndex-1];
    assert(fieldCP.tag == CONSTANT_Fieldref); // precisa ser um fieldRef

    CONSTANT_Fieldref_info fieldRef = fieldCP.info.fieldref_info;

    string className = getFormattedConstant(constantPool, fieldRef.class_index);

    cp_info nameAndTypeCP = constantPool[fieldRef.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info fieldNameAndType = nameAndTypeCP.info.nameAndType_info;

    string fieldName = getFormattedConstant(constantPool, fieldNameAndType.name_index);
    string fieldDescriptor = getFormattedConstant(constantPool, fieldNameAndType.descriptor_index);

    MethodArea &methodArea = MethodArea::getInstance();
    ClassRuntime *classRuntime = methodArea.loadClassNamed(className);

    while (classRuntime != NULL) {
        if (classRuntime->fieldExists(fieldName) == false) {
            if (classRuntime->getClassFile()->super_class == 0) {
                classRuntime = NULL;
            } else {
                string superClassName = getFormattedConstant(classRuntime->getClassFile()->constant_pool, classRuntime->getClassFile()->super_class);
                classRuntime = methodArea.loadClassNamed(superClassName);
            }
        } else {
            break;
        }
    }

    if (classRuntime == NULL) {
        cerr << "NoSuchFieldError" << endl;
        exit(1);
    }

    // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
    if (stackFrame.getTopFrame() != topFrame) return;
    
    Value topValue = topFrame->popTopOfOperandStack();
    if (topValue.type == ValueType::DOUBLE || topValue.type == ValueType::LONG) {
        topFrame->popTopOfOperandStack(); // removendo padding
    } else {
        switch (fieldDescriptor[0]) {
            case 'B':
                topValue.type = ValueType::BYTE;
                topValue.printType = ValueType::BYTE;
                break;
            case 'C':
                topValue.type = ValueType::CHAR;
                topValue.type = ValueType::CHAR;
                break;
            case 'S':
                topValue.type = ValueType::SHORT;
                topValue.type = ValueType::SHORT;
                break;
            case 'Z':
                topValue.type = ValueType::BOOLEAN;
                topValue.type = ValueType::BOOLEAN;
                break;
        }
    }

    classRuntime->putValueIntoField(topValue, fieldName);

    topFrame->pc += 3;
}